

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O0

void soul::heart::Checker::checkConnections(Program *program)

{
  EndpointType EVar1;
  bool bVar2;
  __optional_lt_t<long,_int> _Var3;
  __optional_gt_t<long,_int> _Var4;
  __optional_le_t<unsigned_int,_unsigned_long> _Var5;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this;
  reference this_00;
  Module *pMVar6;
  reference this_01;
  Connection *pCVar7;
  char *pcVar8;
  ProcessorInstance *pPVar9;
  IODeclaration *pIVar10;
  IODeclaration *destInput_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aVar11;
  undefined1 auVar12 [16];
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  uint local_5cc;
  uint local_544;
  string local_498;
  string local_478;
  CompileMessage local_458;
  char *local_420;
  char *local_418;
  CompileMessage local_410;
  CompileMessage local_3d8;
  CompileMessage local_3a0;
  undefined1 local_362;
  undefined1 local_361;
  CompileMessage local_360;
  undefined1 local_322;
  undefined1 local_321;
  CompileMessage local_320;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_278;
  undefined1 local_268 [64];
  undefined1 local_228 [8];
  pool_ptr<soul::Module> destModule;
  pool_ptr<soul::heart::ProcessorInstance> destProcessor;
  undefined1 local_208 [24];
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1a8;
  undefined1 local_198 [64];
  undefined1 local_158 [8];
  pool_ptr<soul::Module> sourceModule;
  pool_ptr<soul::heart::ProcessorInstance> sourceProcessor;
  int local_10c;
  CompileMessage local_108;
  int local_cc;
  undefined1 local_c8 [8];
  string destDescription;
  undefined1 local_98 [8];
  string sourceDescription;
  size_t destInstanceArraySize;
  size_t sourceInstanceArraySize;
  bool destWasAnOutput;
  bool sourceWasAnInput;
  pool_ptr<soul::heart::IODeclaration> destInput;
  pool_ptr<soul::heart::IODeclaration> sourceOutput;
  pool_ref<soul::heart::Connection> *conn;
  iterator __end4;
  iterator __begin4;
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  *__range4;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  Program *program_local;
  
  this = Program::getModules(program);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(this);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (this);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar2) {
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
              ::operator*(&__end2);
    pMVar6 = pool_ref<soul::Module>::operator->(this_00);
    bVar2 = Module::isGraph(pMVar6);
    if (bVar2) {
      pMVar6 = pool_ref<soul::Module>::operator->(this_00);
      __end4 = std::
               vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
               ::begin(&pMVar6->connections);
      conn = (pool_ref<soul::heart::Connection> *)
             std::
             vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
             ::end(&pMVar6->connections);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
                                    *)&conn);
        if (!bVar2) break;
        this_01 = __gnu_cxx::
                  __normal_iterator<soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
                  ::operator*(&__end4);
        pool_ptr<soul::heart::IODeclaration>::pool_ptr(&destInput);
        pool_ptr<soul::heart::IODeclaration>::pool_ptr
                  ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
        sourceInstanceArraySize._7_1_ = false;
        sourceInstanceArraySize._6_1_ = false;
        destInstanceArraySize = 1;
        sourceDescription.field_2._8_8_ = 1;
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        std::__cxx11::string::string((string *)local_98,(string *)&(pCVar7->source).endpointName);
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        std::__cxx11::string::string((string *)local_c8,(string *)&(pCVar7->dest).endpointName);
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&pCVar7->delayLength);
        if (bVar2) {
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          local_cc = 1;
          _Var3 = std::enable_if<is_convertible<decltype(((std::declval<long_const&>)())<((std::
                  declval<int_const&>)())),bool>::value,bool>::type_std::operator<
                            (&pCVar7->delayLength,&local_cc);
          if (_Var3) {
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            Errors::delayLineTooShort<>();
            CodeLocation::throwError(&(pCVar7->super_Object).location,&local_108);
          }
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          local_10c = 0x40000;
          _Var4 = std::operator>(&pCVar7->delayLength,&local_10c);
          if (_Var4) {
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            Errors::delayLineTooLong<>();
            CodeLocation::throwError
                      (&(pCVar7->super_Object).location,(CompileMessage *)&sourceProcessor);
          }
        }
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        sourceModule.object = (Module *)(pCVar7->source).processor.object;
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&sourceModule);
        if (bVar2) {
          pool_ptr<soul::heart::ProcessorInstance>::operator->
                    ((pool_ptr<soul::heart::ProcessorInstance> *)&sourceModule);
          Program::findModuleWithName((Program *)local_158,(string *)program);
          bVar2 = pool_ptr<soul::Module>::operator==
                            ((pool_ptr<soul::Module> *)local_158,(void *)0x0);
          if (bVar2) {
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            pPVar9 = pool_ptr<soul::heart::ProcessorInstance>::operator->
                               ((pool_ptr<soul::heart::ProcessorInstance> *)&sourceModule);
            Errors::cannotFindProcessor<std::__cxx11::string&>
                      ((CompileMessage *)(local_198 + 8),(Errors *)&pPVar9->sourceName,args);
            CodeLocation::throwError
                      (&(pCVar7->super_Object).location,(CompileMessage *)(local_198 + 8));
          }
          pMVar6 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)local_158);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          aVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                    )std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)&(pCVar7->source).endpointName);
          name._M_str = (char *)aVar11._M_allocated_capacity;
          name._M_len = (size_t)pMVar6;
          local_1a8 = aVar11;
          Module::findOutput((Module *)local_198,name);
          pool_ptr<soul::heart::IODeclaration>::operator=
                    (&destInput,(pool_ptr<soul::heart::OutputDeclaration> *)local_198);
          pool_ptr<soul::heart::OutputDeclaration>::~pool_ptr
                    ((pool_ptr<soul::heart::OutputDeclaration> *)local_198);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          bVar2 = std::optional<unsigned_long>::has_value(&(pCVar7->source).endpointIndex);
          if (bVar2) {
            local_544 = 1;
          }
          else {
            pPVar9 = pool_ptr<soul::heart::ProcessorInstance>::operator->
                               ((pool_ptr<soul::heart::ProcessorInstance> *)&sourceModule);
            local_544 = pPVar9->arraySize;
          }
          destInstanceArraySize = (size_t)local_544;
          pPVar9 = pool_ptr<soul::heart::ProcessorInstance>::operator->
                             ((pool_ptr<soul::heart::ProcessorInstance> *)&sourceModule);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1f0 + 8),&pPVar9->instanceName,".");
          std::operator+(&local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1f0 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98);
          std::__cxx11::string::operator=((string *)local_98,(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)(local_1f0 + 8));
          bVar2 = pool_ptr<soul::heart::IODeclaration>::operator==(&destInput,(void *)0x0);
          if (bVar2) {
            pMVar6 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)local_158);
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&(pCVar7->source).endpointName);
            name_00._M_str = auVar12._0_8_;
            name_00._M_len = (size_t)pMVar6;
            local_208._8_16_ = auVar12;
            Module::findInput((Module *)local_1f0,name_00);
            sourceInstanceArraySize._7_1_ =
                 pool_ptr<soul::heart::InputDeclaration>::operator!=
                           ((pool_ptr<soul::heart::InputDeclaration> *)local_1f0,(void *)0x0);
            pool_ptr<soul::heart::InputDeclaration>::~pool_ptr
                      ((pool_ptr<soul::heart::InputDeclaration> *)local_1f0);
          }
          pool_ptr<soul::Module>::~pool_ptr((pool_ptr<soul::Module> *)local_158);
        }
        else {
          pMVar6 = pool_ref<soul::Module>::operator->(this_00);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          pcVar8 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)&(pCVar7->source).endpointName);
          name_01._M_str = pcVar8;
          name_01._M_len = (size_t)pMVar6;
          Module::findInput((Module *)local_208,name_01);
          pool_ptr<soul::heart::IODeclaration>::operator=
                    (&destInput,(pool_ptr<soul::heart::InputDeclaration> *)local_208);
          pool_ptr<soul::heart::InputDeclaration>::~pool_ptr
                    ((pool_ptr<soul::heart::InputDeclaration> *)local_208);
        }
        pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
                  ((pool_ptr<soul::heart::ProcessorInstance> *)&sourceModule);
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        destModule.object = (Module *)(pCVar7->dest).processor.object;
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&destModule);
        if (bVar2) {
          pool_ptr<soul::heart::ProcessorInstance>::operator->
                    ((pool_ptr<soul::heart::ProcessorInstance> *)&destModule);
          Program::findModuleWithName((Program *)local_228,(string *)program);
          bVar2 = pool_ptr<soul::Module>::operator==
                            ((pool_ptr<soul::Module> *)local_228,(void *)0x0);
          if (bVar2) {
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            pPVar9 = pool_ptr<soul::heart::ProcessorInstance>::operator->
                               ((pool_ptr<soul::heart::ProcessorInstance> *)&destModule);
            Errors::cannotFindProcessor<std::__cxx11::string&>
                      ((CompileMessage *)(local_268 + 8),(Errors *)&pPVar9->sourceName,args_00);
            CodeLocation::throwError
                      (&(pCVar7->super_Object).location,(CompileMessage *)(local_268 + 8));
          }
          pMVar6 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)local_228);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          aVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                    )std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)&(pCVar7->dest).endpointName);
          args_1 = aVar11._8_8_;
          name_02._M_str = (char *)aVar11._M_allocated_capacity;
          name_02._M_len = (size_t)pMVar6;
          local_278 = aVar11;
          Module::findInput((Module *)local_268,name_02);
          pool_ptr<soul::heart::IODeclaration>::operator=
                    ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0,
                     (pool_ptr<soul::heart::InputDeclaration> *)local_268);
          pool_ptr<soul::heart::InputDeclaration>::~pool_ptr
                    ((pool_ptr<soul::heart::InputDeclaration> *)local_268);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          bVar2 = std::optional<unsigned_long>::has_value(&(pCVar7->dest).endpointIndex);
          if (bVar2) {
            local_5cc = 1;
          }
          else {
            pPVar9 = pool_ptr<soul::heart::ProcessorInstance>::operator->
                               ((pool_ptr<soul::heart::ProcessorInstance> *)&destModule);
            local_5cc = pPVar9->arraySize;
          }
          sourceDescription.field_2._8_8_ = ZEXT48(local_5cc);
          pPVar9 = pool_ptr<soul::heart::ProcessorInstance>::operator->
                             ((pool_ptr<soul::heart::ProcessorInstance> *)&destModule);
          std::operator+(&local_2b8,&pPVar9->instanceName,".");
          std::operator+(&local_298,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
          std::__cxx11::string::operator=((string *)local_c8,(string *)&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
          bVar2 = pool_ptr<soul::heart::IODeclaration>::operator==
                            ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0,
                             (void *)0x0);
          if (bVar2) {
            pMVar6 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)local_228);
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&(pCVar7->dest).endpointName);
            args_1 = auVar12._8_8_;
            name_03._M_str = auVar12._0_8_;
            name_03._M_len = (size_t)pMVar6;
            local_2d8._8_16_ = auVar12;
            Module::findOutput((Module *)(local_2d8 + 0x18),name_03);
            sourceInstanceArraySize._6_1_ =
                 pool_ptr<soul::heart::OutputDeclaration>::operator!=
                           ((pool_ptr<soul::heart::OutputDeclaration> *)(local_2d8 + 0x18),
                            (void *)0x0);
            pool_ptr<soul::heart::OutputDeclaration>::~pool_ptr
                      ((pool_ptr<soul::heart::OutputDeclaration> *)(local_2d8 + 0x18));
          }
          pool_ptr<soul::Module>::~pool_ptr((pool_ptr<soul::Module> *)local_228);
        }
        else {
          pMVar6 = pool_ref<soul::Module>::operator->(this_00);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&(pCVar7->dest).endpointName);
          args_1 = auVar12._8_8_;
          name_04._M_str = auVar12._0_8_;
          name_04._M_len = (size_t)pMVar6;
          local_2e8 = auVar12;
          Module::findOutput((Module *)local_2d8,name_04);
          pool_ptr<soul::heart::IODeclaration>::operator=
                    ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0,
                     (pool_ptr<soul::heart::OutputDeclaration> *)local_2d8);
          pool_ptr<soul::heart::OutputDeclaration>::~pool_ptr
                    ((pool_ptr<soul::heart::OutputDeclaration> *)local_2d8);
        }
        pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
                  ((pool_ptr<soul::heart::ProcessorInstance> *)&destModule);
        bVar2 = pool_ptr<soul::heart::IODeclaration>::operator==(&destInput,(void *)0x0);
        if (bVar2) {
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          local_321 = 0;
          local_322 = 0;
          if (sourceInstanceArraySize._7_1_ == false) {
            Errors::cannotFindSource<std::__cxx11::string&>(&local_320,(Errors *)local_98,args_01);
            local_322 = 1;
          }
          else {
            Errors::cannotConnectFromAnInput<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_320,(Errors *)local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,args_1);
            local_321 = 1;
          }
          CodeLocation::throwError(&(pCVar7->super_Object).location,&local_320);
        }
        bVar2 = pool_ptr<soul::heart::IODeclaration>::operator==
                          ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0,
                           (void *)0x0);
        if (bVar2) {
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          local_361 = 0;
          local_362 = 0;
          if (sourceInstanceArraySize._6_1_ == false) {
            Errors::cannotFindDestination<std::__cxx11::string&>
                      (&local_360,(Errors *)local_c8,args_02);
            local_362 = 1;
          }
          else {
            Errors::cannotConnectToAnOutput<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_360,(Errors *)local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,args_1);
            local_361 = 1;
          }
          CodeLocation::throwError(&(pCVar7->super_Object).location,&local_360);
        }
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&(pCVar7->source).endpointIndex);
        if (bVar2) {
          pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          _Var5 = std::enable_if<is_convertible<decltype(((std::
                  declval<unsigned_int_const&>)())<=((std::declval<unsigned_long_const&>)())),bool>
                  ::value,bool>::type_std::operator<=
                            (&pIVar10->arraySize,&(pCVar7->source).endpointIndex);
          if (_Var5) {
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            Errors::sourceEndpointIndexOutOfRange<>();
            CodeLocation::throwError(&(pCVar7->super_Object).location,&local_3a0);
          }
        }
        pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&(pCVar7->dest).endpointIndex);
        if (bVar2) {
          pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->
                              ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          _Var5 = std::enable_if<is_convertible<decltype(((std::
                  declval<unsigned_int_const&>)())<=((std::declval<unsigned_long_const&>)())),bool>
                  ::value,bool>::type_std::operator<=
                            (&pIVar10->arraySize,&(pCVar7->dest).endpointIndex);
          if (_Var5) {
            pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
            Errors::destinationEndpointIndexOutOfRange<>();
            CodeLocation::throwError(&(pCVar7->super_Object).location,&local_3d8);
          }
        }
        pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
        EVar1 = pIVar10->endpointType;
        pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->
                            ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
        if (EVar1 != pIVar10->endpointType) {
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
          local_418 = getEndpointTypeName(pIVar10->endpointType);
          pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->
                              ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
          local_420 = getEndpointTypeName(pIVar10->endpointType);
          Errors::cannotConnect<std::__cxx11::string&,char_const*,std::__cxx11::string&,char_const*>
                    (&local_410,(Errors *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_418
                     ,(char **)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_420
                     ,(char **)in_R9);
          CodeLocation::throwError(&(pCVar7->super_Object).location,&local_410);
        }
        pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
        bVar2 = IODeclaration::isEventEndpoint(pIVar10);
        pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator*(&destInput);
        destInput_00 = pool_ptr<soul::heart::IODeclaration>::operator*
                                 ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
        bVar2 = areConnectionTypesCompatible
                          (bVar2,pIVar10,destInstanceArraySize,destInput_00,
                           sourceDescription.field_2._8_8_);
        if (!bVar2) {
          pCVar7 = pool_ref<soul::heart::Connection>::operator->(this_01);
          pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
          IODeclaration::getTypesDescription_abi_cxx11_(&local_478,pIVar10);
          pIVar10 = pool_ptr<soul::heart::IODeclaration>::operator->
                              ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
          IODeclaration::getTypesDescription_abi_cxx11_(&local_498,pIVar10);
          Errors::
          cannotConnect<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string>
                    (&local_458,(Errors *)local_98,&local_478,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_498,in_R9);
          CodeLocation::throwError(&(pCVar7->super_Object).location,&local_458);
        }
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string((string *)local_98);
        pool_ptr<soul::heart::IODeclaration>::~pool_ptr
                  ((pool_ptr<soul::heart::IODeclaration> *)&stack0xffffffffffffffa0);
        pool_ptr<soul::heart::IODeclaration>::~pool_ptr(&destInput);
        __gnu_cxx::
        __normal_iterator<soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
        ::operator++(&__end4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static void checkConnections (const Program& program)
    {
        for (auto& m : program.getModules())
        {
            if (m->isGraph())
            {
                for (auto& conn : m->connections)
                {
                    pool_ptr<heart::IODeclaration> sourceOutput, destInput;
                    bool sourceWasAnInput = false, destWasAnOutput = false;
                    size_t sourceInstanceArraySize = 1, destInstanceArraySize = 1;
                    auto sourceDescription = conn->source.endpointName;
                    auto destDescription   = conn->dest.endpointName;

                    if (conn->delayLength)
                    {
                        if (conn->delayLength < 1)
                            conn->location.throwError (Errors::delayLineTooShort());

                        if (conn->delayLength > (int32_t) AST::maxDelayLineLength)
                            conn->location.throwError (Errors::delayLineTooLong());
                    }

                    if (auto sourceProcessor = conn->source.processor)
                    {
                        auto sourceModule = program.findModuleWithName (sourceProcessor->sourceName);

                        if (sourceModule == nullptr)
                            conn->location.throwError (Errors::cannotFindProcessor (sourceProcessor->sourceName));

                        sourceOutput = sourceModule->findOutput (conn->source.endpointName);
                        sourceInstanceArraySize = conn->source.endpointIndex.has_value() ? 1 : sourceProcessor->arraySize;
                        sourceDescription = sourceProcessor->instanceName + "." + sourceDescription;

                        if (sourceOutput == nullptr)
                            sourceWasAnInput = sourceModule->findInput (conn->source.endpointName) != nullptr;
                    }
                    else
                    {
                        sourceOutput = m->findInput (conn->source.endpointName);
                    }

                    if (auto destProcessor = conn->dest.processor)
                    {
                        auto destModule = program.findModuleWithName (destProcessor->sourceName);

                        if (destModule == nullptr)
                            conn->location.throwError (Errors::cannotFindProcessor (destProcessor->sourceName));

                        destInput = destModule->findInput (conn->dest.endpointName);
                        destInstanceArraySize = conn->dest.endpointIndex.has_value() ? 1 : destProcessor->arraySize;
                        destDescription = destProcessor->instanceName + "." + destDescription;

                        if (destInput == nullptr)
                            destWasAnOutput = destModule->findOutput (conn->dest.endpointName) != nullptr;
                    }
                    else
                    {
                        destInput = m->findOutput (conn->dest.endpointName);
                    }

                    if (sourceOutput == nullptr)
                        conn->location.throwError (sourceWasAnInput ? Errors::cannotConnectFromAnInput (sourceDescription, destDescription)
                                                                    : Errors::cannotFindSource (sourceDescription));

                    if (destInput == nullptr)
                        conn->location.throwError (destWasAnOutput ? Errors::cannotConnectToAnOutput (sourceDescription, destDescription)
                                                                   : Errors::cannotFindDestination (destDescription));

                    if (conn->source.endpointIndex && sourceOutput->arraySize <= conn->source.endpointIndex)
                        conn->location.throwError (Errors::sourceEndpointIndexOutOfRange());

                    if (conn->dest.endpointIndex && destInput->arraySize <= conn->dest.endpointIndex)
                        conn->location.throwError (Errors::destinationEndpointIndexOutOfRange());

                    if (sourceOutput->endpointType != destInput->endpointType)
                        conn->location.throwError (Errors::cannotConnect (sourceDescription, getEndpointTypeName (sourceOutput->endpointType),
                                                                          destDescription, getEndpointTypeName (destInput->endpointType)));

                    if (! areConnectionTypesCompatible (sourceOutput->isEventEndpoint(),
                                                        *sourceOutput,
                                                        sourceInstanceArraySize,
                                                        *destInput,
                                                        destInstanceArraySize))
                        conn->location.throwError (Errors::cannotConnect (sourceDescription, sourceOutput->getTypesDescription(),
                                                                          destDescription, destInput->getTypesDescription()));
                }
            }
        }
    }